

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O2

bool __thiscall
basisu::basis_compressor::generate_mipmaps
          (basis_compressor *this,image *img,vector<basisu::image> *mips,bool has_alpha)

{
  bool bVar1;
  uint uVar2;
  value_type *this_00;
  image *src;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  uint32_t uVar8;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  interval_timer tm;
  
  debug_printf("basis_compressor::generate_mipmaps\n");
  interval_timer::interval_timer(&tm);
  interval_timer::start(&tm);
  uVar6 = img->m_width;
  uVar8 = img->m_height;
  uVar2 = 1;
  auVar9 = pmovsxbd(in_XMM1,0x1010101);
  while( true ) {
    uVar3 = uVar8;
    if (uVar8 < uVar6) {
      uVar3 = uVar6;
    }
    if (uVar3 <= (uint)(this->m_params).m_mip_smallest_dimension.m_value) break;
    uVar5 = uVar6 >> 1;
    uVar7 = uVar8 >> 1;
    uVar3 = auVar9._0_4_;
    uVar6 = (uVar5 < uVar3) * uVar3 | (uVar5 >= uVar3) * uVar5;
    uVar3 = auVar9._4_4_;
    uVar8 = (uVar7 < uVar3) * uVar3 | (uVar7 >= uVar3) * uVar7;
    uVar2 = uVar2 + 1;
  }
  uVar4 = 1;
  do {
    if (uVar2 <= uVar4) {
      if ((this->m_params).m_debug.m_value == true) {
        interval_timer::get_elapsed_secs(&tm);
        debug_printf("Total mipmap generation time: %3.3f secs\n");
      }
LAB_002179f5:
      return uVar2 <= uVar4;
    }
    uVar5 = img->m_width >> ((byte)uVar4 & 0x1f);
    uVar3 = img->m_height >> ((byte)uVar4 & 0x1f);
    this_00 = enlarge_vector<basisu::vector<basisu::image>>(mips,1);
    image::resize(this_00,uVar5 + (uVar5 == 0),uVar3 + (uVar3 == 0),0xffffffff,
                  (color_rgba *)&g_black_color);
    src = img;
    if ((1 < uVar4) && ((this->m_params).m_mip_fast.m_value != false)) {
      src = vector<basisu::image>::operator[](mips,uVar4 - 1);
    }
    bVar1 = image_resample(src,this_00,(this->m_params).m_mip_srgb.m_value,
                           (this->m_params).m_mip_filter._M_dataplus._M_p,
                           (this->m_params).m_mip_scale.m_value,
                           (this->m_params).m_mip_wrapping.m_value,0,has_alpha + 3);
    if (!bVar1) {
      error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
      goto LAB_002179f5;
    }
    if ((this->m_params).m_mip_renormalize.m_value == true) {
      image::renormalize_normal_map(this_00);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

bool basis_compressor::generate_mipmaps(const image &img, basisu::vector<image> &mips, bool has_alpha)
	{
		debug_printf("basis_compressor::generate_mipmaps\n");

		interval_timer tm;
		tm.start();

		uint32_t total_levels = 1;
		uint32_t w = img.get_width(), h = img.get_height();
		while (maximum<uint32_t>(w, h) > (uint32_t)m_params.m_mip_smallest_dimension)
		{
			w = maximum(w >> 1U, 1U);
			h = maximum(h >> 1U, 1U);
			total_levels++;
		}

#if BASISU_USE_STB_IMAGE_RESIZE_FOR_MIPMAP_GEN
		// Requires stb_image_resize
		stbir_filter filter = STBIR_FILTER_DEFAULT;
		if (m_params.m_mip_filter == "box")
			filter = STBIR_FILTER_BOX;
		else if (m_params.m_mip_filter == "triangle")
			filter = STBIR_FILTER_TRIANGLE;
		else if (m_params.m_mip_filter == "cubic")
			filter = STBIR_FILTER_CUBICBSPLINE;
		else if (m_params.m_mip_filter == "catmull")
			filter = STBIR_FILTER_CATMULLROM;
		else if (m_params.m_mip_filter == "mitchell")
			filter = STBIR_FILTER_MITCHELL;

		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image &level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);
						
			int result = stbir_resize_uint8_generic( 
				(const uint8_t *)img.get_ptr(), img.get_width(), img.get_height(), img.get_pitch() * sizeof(color_rgba),
            (uint8_t *)level_img.get_ptr(), level_img.get_width(), level_img.get_height(), level_img.get_pitch() * sizeof(color_rgba),
            has_alpha ? 4 : 3, has_alpha ? 3 : STBIR_ALPHA_CHANNEL_NONE, m_params.m_mip_premultiplied ? STBIR_FLAG_ALPHA_PREMULTIPLIED : 0,
            m_params.m_mip_wrapping ? STBIR_EDGE_WRAP : STBIR_EDGE_CLAMP, filter, m_params.m_mip_srgb ? STBIR_COLORSPACE_SRGB : STBIR_COLORSPACE_LINEAR, 
				nullptr);

			if (result == 0)
			{
				error_printf("basis_compressor::generate_mipmaps: stbir_resize_uint8_generic() failed!\n");
				return false;
			}
			
			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#else
		for (uint32_t level = 1; level < total_levels; level++)
		{
			const uint32_t level_width = maximum<uint32_t>(1, img.get_width() >> level);
			const uint32_t level_height = maximum<uint32_t>(1, img.get_height() >> level);

			image& level_img = *enlarge_vector(mips, 1);
			level_img.resize(level_width, level_height);

			const image* pSource_image = &img;

			if (m_params.m_mip_fast)
			{
				if (level > 1)
					pSource_image = &mips[level - 1];
			}

			bool status = image_resample(*pSource_image, level_img, m_params.m_mip_srgb, m_params.m_mip_filter.c_str(), m_params.m_mip_scale, m_params.m_mip_wrapping, 0, has_alpha ? 4 : 3);
			if (!status)
			{
				error_printf("basis_compressor::generate_mipmaps: image_resample() failed!\n");
				return false;
			}

			if (m_params.m_mip_renormalize)
				level_img.renormalize_normal_map();
		}
#endif

		if (m_params.m_debug)
			debug_printf("Total mipmap generation time: %3.3f secs\n", tm.get_elapsed_secs());

		return true;
	}